

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSampleComputeInstance *this)

{
  ulong uVar1;
  ChannelOrder *pCVar2;
  ChannelOrder *pCVar3;
  ShaderInputInterface SVar4;
  DescriptorUpdateMethod DVar5;
  Allocation *pAVar6;
  TextureFormat *pTVar7;
  void *pvVar8;
  undefined1 auVar9 [8];
  undefined1 auVar10 [8];
  size_t sVar11;
  ostream *poVar12;
  VkDescriptorUpdateTemplateKHR updateTemplate;
  ulong uVar13;
  deUint32 dVar14;
  long lVar15;
  int resultNdx;
  uint uVar16;
  int samplePosNdx;
  char *pcVar17;
  VkSampler *pVVar18;
  TestStatus *pTVar19;
  ulong uVar20;
  VkSampler *pImmutableSamplers;
  pointer rawUpdateData;
  VkDescriptorSetLayout *descriptorSetLayouts;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Vec4 result;
  VkSampler samplers [2];
  Vec4 reference;
  ostringstream msg;
  VkDescriptorSet descriptorSets [1];
  Vec4 results [4];
  TextureFormat local_478;
  TextureFormat TStack_470;
  TestStatus *local_460;
  undefined1 local_458 [40];
  undefined1 auStack_430 [24];
  VkDescriptorSetLayout local_418;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_410;
  pointer local_3f8;
  ulong local_3f0;
  pointer local_3e8;
  pointer pVStack_3e0;
  pointer local_3d8;
  undefined8 uStack_3d0;
  undefined1 local_3c8 [32];
  pointer local_3a8;
  undefined1 local_398 [8];
  TextureFormat TStack_390;
  TextureFormat local_388;
  ChannelOrder CStack_380;
  ChannelType CStack_37c;
  TextureFormat local_378;
  pointer local_370;
  pointer local_368;
  pointer local_358;
  ios_base local_320 [264];
  undefined1 local_218 [24];
  VkPipelineLayout VStack_200;
  Handle<(vk::HandleType)20> local_1f8;
  DepthStencilMode local_1f0;
  uint local_1ec;
  Handle<(vk::HandleType)20> local_1e8;
  int local_1e0;
  VkDevice local_1d8;
  int local_1d0;
  Handle<(vk::HandleType)20> local_1c8;
  int local_1c0;
  VkBufferMemoryBarrier *local_1b8;
  ios_base local_1a8 [264];
  pointer local_a0;
  TextureFormat local_98 [9];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Accessing resource in a compute program.\n",0x29);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Single descriptor set. Descriptor set contains ",0x2f);
    SVar4 = this->m_shaderInterface;
    if (SVar4 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar17 = "single";
LAB_0050eaf7:
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar17,sVar11);
    }
    else {
      if (SVar4 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar17 = "an array (size 2) of";
        goto LAB_0050eaf7;
      }
      if (SVar4 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
        pcVar17 = "two";
        goto LAB_0050eaf7;
      }
      std::ios::clear((int)&local_478 + (int)*(undefined8 *)(local_218._0_8_ - 0x18) + 0x260);
    }
    lVar15 = 0x3a;
    pcVar17 = " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
LAB_0050eb42:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar17,lVar15);
  }
  else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Single descriptor set. Descriptor set contains ",0x2f);
    SVar4 = this->m_shaderInterface;
    if (SVar4 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar17 = "single";
LAB_0050eaa3:
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar17,sVar11);
    }
    else {
      if (SVar4 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar17 = "an array (size 2) of";
        goto LAB_0050eaa3;
      }
      if (SVar4 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
        pcVar17 = "two";
        goto LAB_0050eaa3;
      }
      std::ios::clear((int)&local_478 + (int)*(undefined8 *)(local_218._0_8_ - 0x18) + 0x260);
    }
    lVar15 = 0x40;
    pcVar17 = " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
    goto LAB_0050eb42;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Image view type is ",0x13);
  pcVar17 = ::vk::getImageViewTypeName(this->m_viewType);
  if (pcVar17 == (char *)0x0) {
    std::ios::clear((int)&local_478 + (int)*(undefined8 *)(local_218._0_8_ - 0x18) + 0x260);
  }
  else {
    sVar11 = strlen(pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar17,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
  if (this->m_baseMipLevel != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Image view base mip level = ",0x1c);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_218);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  }
  if (this->m_baseArraySlice != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Image view base array slice = ",0x1e);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_218);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  }
  bVar21 = this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR;
  pcVar17 = "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";
  if (bVar21) {
    pcVar17 = "Sampler mode is LINEAR, with WRAP\n";
  }
  lVar15 = 0x49;
  if (bVar21) {
    lVar15 = 0x22;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar17,lVar15);
  uVar16 = 0;
  local_460 = __return_storage_ptr__;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Test sample ",0xc);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_218,uVar16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": sample at position ",0x15);
    ImageSampleInstanceImages::getSamplePos
              ((ImageSampleInstanceImages *)local_398,this->m_viewType,this->m_baseMipLevel,
               this->m_baseArraySlice,uVar16);
    tcu::operator<<(poVar12,(Vector<float,_4> *)local_398);
    if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
        lVar15 = 0x1d;
        pcVar17 = " from combined image sampler ";
      }
      else {
        if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_0050ed45;
        lVar15 = 0xf;
        pcVar17 = " using sampler ";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar17,lVar15);
      std::ostream::operator<<((ostream *)local_218,uVar16 & 1);
    }
LAB_0050ed45:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 4);
  local_398 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_390);
  pVVar18 = (VkSampler *)local_458;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&TStack_390,(char *)local_458._0_8_,local_458._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_390);
  std::ios_base::~ios_base(local_320);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base(local_1a8);
  local_458._0_8_ =
       (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
       m_internal;
  local_458._8_8_ =
       (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
       m_internal;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_398);
  DVar5 = this->m_updateMethod;
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_398,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
             (VkSampler *)0x0);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    ::vk::DescriptorSetLayoutBuilder::addBinding
              ((DescriptorSetLayoutBuilder *)local_398,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,1,0x20,
               (VkSampler *)0x0);
  }
  SVar4 = this->m_shaderInterface;
  if (SVar4 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    dVar14 = 2;
  }
  else if (SVar4 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    pVVar18 = (VkSampler *)local_458;
    if ((this->m_images).m_isImmutable == false) {
      pVVar18 = (VkSampler *)0x0;
    }
    dVar14 = 1;
    ::vk::DescriptorSetLayoutBuilder::addBinding
              ((DescriptorSetLayoutBuilder *)local_398,this->m_descriptorType,1,0x20,pVVar18);
    pVVar18 = (VkSampler *)(local_458 + 8);
  }
  else {
    if (SVar4 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_0050ef0c;
    dVar14 = 1;
  }
  pImmutableSamplers = (VkSampler *)0x0;
  if ((this->m_images).m_isImmutable != false) {
    pImmutableSamplers = pVVar18;
  }
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_398,this->m_descriptorType,dVar14,0x20,
             pImmutableSamplers);
LAB_0050ef0c:
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_218,
             (DescriptorSetLayoutBuilder *)local_398,this->m_vki,this->m_device,
             (uint)((DVar5 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
                   DESCRIPTOR_UPDATE_METHOD_WITH_PUSH));
  if (local_368 != (pointer)0x0) {
    operator_delete(local_368,(long)local_358 - (long)local_368);
  }
  pvVar8 = (void *)CONCAT44(CStack_37c,CStack_380);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,(long)local_370 - (long)pvVar8);
  }
  if (local_398 != (undefined1  [8])0x0) {
    operator_delete((void *)local_398,(long)local_388 - (long)local_398);
  }
  local_418.m_internal = local_218._0_8_;
  DStack_410.m_deviceIface = (DeviceInterface *)local_218._8_8_;
  DStack_410.m_device = (VkDevice)local_218._16_8_;
  DStack_410.m_allocator = (VkAllocationCallbacks *)VStack_200.m_internal;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_218);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_218,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  dVar14 = 0;
  if ((ulong)this->m_shaderInterface < 4) {
    dVar14 = *(deUint32 *)(&DAT_00abd6d0 + (ulong)this->m_shaderInterface * 4);
  }
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_218,this->m_descriptorType,dVar14);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    ::vk::DescriptorPoolBuilder::addType
              ((DescriptorPoolBuilder *)local_218,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,1);
  }
  descriptorSetLayouts = (VkDescriptorSetLayout *)&DAT_00000001;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_398,(DescriptorPoolBuilder *)local_218,
             this->m_vki,this->m_device,1,1);
  if ((void *)local_218._0_8_ != (void *)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  auVar9 = local_398;
  local_3c8._16_8_ = local_398;
  local_3c8._24_4_ = TStack_390.order;
  local_3c8._28_4_ = TStack_390.type;
  local_3a8 = (pointer)local_388;
  local_378 = (TextureFormat)local_458;
  local_458._0_8_ = local_418.m_internal;
  local_398._0_4_ = 0x22;
  auVar10 = local_398;
  TStack_390.order = R;
  TStack_390.type = SNORM_INT8;
  local_398._0_4_ = auVar9._0_4_;
  local_398._4_4_ = auVar9._4_4_;
  local_388.order = local_398._0_4_;
  local_388.type = local_398._4_4_;
  CStack_380 = A;
  local_398 = auVar10;
  if ((this->m_updateMethod & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
      DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    stack0xfffffffffffffdf8 = (undefined1  [16])0x0;
    local_218._0_16_ = (undefined1  [16])0x0;
  }
  else {
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)local_218,this->m_vki,this->m_device,
               (VkDescriptorSetAllocateInfo *)local_398);
    writeDescriptorSet(this,(VkDescriptorSet)local_218._0_8_,(VkDescriptorSetLayout)local_458._0_8_,
                       (VkPipelineLayout)0x0);
  }
  local_3e8 = (pointer)local_218._0_8_;
  pVStack_3e0 = (pointer)local_218._8_8_;
  local_3d8 = (pointer)local_218._16_8_;
  uStack_3d0 = VStack_200.m_internal;
  ComputePipeline::ComputePipeline
            ((ComputePipeline *)local_458,this->m_vki,this->m_device,
             ((this->super_TestInstance).m_context)->m_progCollection,(deUint32)&local_418,
             descriptorSetLayouts);
  local_1e8.m_internal = (deUint64)&local_a0;
  local_3f8 = local_3e8;
  local_a0 = local_3e8;
  DVar5 = this->m_updateMethod;
  local_218._0_8_ = this->m_vki;
  local_218._8_8_ = this->m_device;
  VStack_200.m_internal = local_458._0_8_;
  local_218._16_8_ = local_458._32_8_;
  local_1f8.m_internal = 0x100000004;
  local_1f0 = MODE_STENCIL;
  local_1b8 = &(this->m_result).m_bufferBarrier;
  local_1ec = (uint)(DVar5 - DESCRIPTOR_UPDATE_METHOD_LAST < 0xfffffffe);
  rawUpdateData = (pointer)0x0;
  local_1e0 = 0;
  local_1d8 = (VkDevice)0x0;
  local_1d0 = 0;
  local_1c8.m_internal = 0;
  local_1c0 = 1;
  if (DVar5 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    writeDescriptorSet(this,(VkDescriptorSet)0x0,local_418,(VkPipelineLayout)local_458._0_8_);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_218,this->m_queueFamilyIndex,this->m_queue,
               &this->m_updateBuilder);
  }
  else {
    updateTemplate.m_internal = 0;
    if (DVar5 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      writeDescriptorSet(this,(VkDescriptorSet)0x0,local_418,(VkPipelineLayout)local_458._0_8_);
      updateTemplate.m_internal =
           (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal;
      rawUpdateData =
           (this->m_updateRegistry).m_updateEntries.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_218,this->m_queueFamilyIndex,this->m_queue,updateTemplate,
               rawUpdateData);
  }
  pAVar6 = (this->m_result).m_bufferMem.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            ((this->m_result).m_vki,(this->m_result).m_device,
             (VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,0x40);
  pTVar7 = (TextureFormat *)
           ((this->m_result).m_bufferMem.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  local_98[6] = pTVar7[6];
  local_98[7] = pTVar7[7];
  local_98[4] = pTVar7[4];
  local_98[5] = pTVar7[5];
  local_98[2] = pTVar7[2];
  local_98[3] = pTVar7[3];
  local_98[0] = *pTVar7;
  local_98[1] = pTVar7[1];
  lVar15 = 0;
  bVar21 = true;
  samplePosNdx = 0;
  uVar20 = 0;
LAB_0050f2e4:
  do {
    local_478 = local_98[lVar15 * 2];
    TStack_470 = local_98[lVar15 * 2 + 1];
    ImageSampleInstanceImages::fetchSampleValue
              ((ImageSampleInstanceImages *)local_3c8,(int)this + 0xf0);
    pTVar19 = local_460;
    local_398 = (undefined1  [8])0xbf800000bf800000;
    TStack_390.order = 0xbf800000;
    TStack_390.type = 0xbf800000;
    if (((float)local_478.order != -1.0) || (NAN((float)local_478.order))) {
LAB_0050f328:
      uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
    }
    else {
      uVar13 = 0xffffffffffffffff;
      do {
        if (uVar13 == 2) goto LAB_0050f32b;
        pCVar2 = &TStack_470.order + uVar13;
        uVar1 = uVar13 + 1;
        pCVar3 = &TStack_390.order + uVar13;
      } while (((float)*pCVar2 == (float)*pCVar3) &&
              (uVar13 = uVar1, !NAN((float)*pCVar2) && !NAN((float)*pCVar3)));
      if (uVar1 < 3) goto LAB_0050f328;
    }
LAB_0050f32b:
    auVar24._0_4_ = (float)local_478.order - (float)local_3c8._0_4_;
    auVar24._4_4_ = (float)local_478.type - (float)local_3c8._4_4_;
    auVar24._8_4_ = (float)TStack_470.order - (float)local_3c8._8_4_;
    auVar24._12_4_ = (float)TStack_470.type - (float)local_3c8._12_4_;
    uVar13 = CONCAT44(auVar24._4_4_,auVar24._0_4_);
    auVar23._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar23._8_4_ = -auVar24._8_4_;
    auVar23._12_4_ = -auVar24._12_4_;
    auVar24 = maxps(auVar23,auVar24);
    auVar22._4_4_ = -(uint)(0.03137255 < auVar24._4_4_);
    auVar22._0_4_ = -(uint)(0.03137255 < auVar24._0_4_);
    auVar22._8_4_ = -(uint)(0.03137255 < auVar24._8_4_);
    auVar22._12_4_ = -(uint)(0.03137255 < auVar24._12_4_);
    auVar24 = packssdw(auVar22,auVar22);
    auVar24 = packsswb(auVar24,auVar24);
    uVar16 = SUB164(auVar24 & _DAT_00a98960,0);
    if ((((SUB161(auVar24 & _DAT_00a98960,0) != '\0') || ((uVar16 >> 8 & 1) != 0)) ||
        ((uVar16 >> 0x10 & 1) != 0)) || ((uVar16 >> 0x18 & 1) != 0)) {
      local_398 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_390);
      local_3f0 = uVar20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_390,"Test sample ",0xc);
      std::ostream::operator<<(&TStack_390,samplePosNdx);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_390,":\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_390,"\tSampling at ",0xd);
      ImageSampleInstanceImages::getSamplePos
                ((ImageSampleInstanceImages *)&stack0xffffffffffffffb0,this->m_viewType,
                 this->m_baseMipLevel,this->m_baseArraySlice,samplePosNdx);
      tcu::operator<<((ostream *)&TStack_390,(Vector<float,_4> *)&stack0xffffffffffffffb0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_390,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_390,"\tError expected ",0x10);
      tcu::operator<<((ostream *)&TStack_390,(Vector<float,_4> *)local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_390,", got ",6);
      tcu::operator<<((ostream *)&TStack_390,(Vector<float,_4> *)&local_478);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_390);
      std::ios_base::~ios_base(local_320);
      samplePosNdx = samplePosNdx + 1;
      lVar15 = lVar15 + 1;
      bVar21 = false;
      uVar20 = local_3f0;
      if (lVar15 == 4) goto LAB_0050f550;
      goto LAB_0050f2e4;
    }
    samplePosNdx = samplePosNdx + 1;
    lVar15 = lVar15 + 1;
    if (lVar15 == 4) {
      if (bVar21) {
        local_398 = (undefined1  [8])&local_388;
        TStack_390.order = LA;
        TStack_390.type = SNORM_INT8;
        local_388._0_5_ = 0x73736150;
        local_460->m_code = QP_TEST_RESULT_PASS;
        (local_460->m_description)._M_dataplus._M_p = (pointer)&(local_460->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_460->m_description,local_398);
      }
      else {
LAB_0050f550:
        if ((uVar20 & 1) == 0) {
          local_398 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_390);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&TStack_390,"Result buffer was not written to.",0x21);
          pTVar19 = local_460;
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_390);
          std::ios_base::~ios_base(local_320);
          local_398 = (undefined1  [8])&local_388;
          local_478.order = 0x20;
          local_478.type = SNORM_INT8;
          local_398 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_398,(ulong)&local_478);
          local_388 = local_478;
          ((pointer)local_398)->pImmutableSamplers = (VkSampler *)0x727720746f6e2073;
          *(undefined8 *)((long)local_398 + 0x18) = 0x6f74206e65747469;
          *(undefined8 *)local_398 = 0x6220746c75736552;
          *(undefined8 *)&((pointer)local_398)->descriptorCount = 0x6177207265666675;
          TStack_390 = local_478;
          *(char *)((long)local_478 + (long)&((pointer)local_398)->binding) = '\0';
          pTVar19->m_code = QP_TEST_RESULT_FAIL;
          (pTVar19->m_description)._M_dataplus._M_p = (pointer)&(pTVar19->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar19->m_description,local_398,
                     (char *)((long)&((pointer)local_398)->binding + (long)local_478));
        }
        else {
          local_398 = (undefined1  [8])&local_388;
          local_478.order = CHANNELORDER_LAST;
          local_478.type = SNORM_INT8;
          local_398 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_398,(ulong)&local_478);
          pTVar19 = local_460;
          local_388 = local_478;
          *(undefined8 *)local_398 = 0x2064696c61766e49;
          *(undefined8 *)&((pointer)local_398)->descriptorCount = 0x7620746c75736572;
          *(undefined8 *)((long)&((pointer)local_398)->stageFlags + 1) = 0x7365756c61762074;
          TStack_390 = local_478;
          *(char *)((long)local_478 + (long)&((pointer)local_398)->binding) = '\0';
          local_460->m_code = QP_TEST_RESULT_FAIL;
          (local_460->m_description)._M_dataplus._M_p = (pointer)&(local_460->m_description).field_2
          ;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_460->m_description,local_398,
                     (char *)((long)&((pointer)local_398)->binding + (long)local_478));
        }
      }
      if (local_398 != (undefined1  [8])&local_388) {
        operator_delete((void *)local_398,(long)local_388 + 1);
      }
      if (local_458._32_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)18>_> *)auStack_430,
                   (VkPipeline)local_458._32_8_);
      }
      auStack_430._8_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffbc8 = (undefined1  [16])0x0;
      if (local_458._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_458 + 8),
                   (VkPipelineLayout)local_458._0_8_);
      }
      if (local_3f8 != (pointer)0x0) {
        local_398 = (undefined1  [8])local_3f8;
        (**(_func_int **)((long)*pVStack_3e0 + 0x1e8))(pVStack_3e0,local_3d8,uStack_3d0,1);
      }
      if (local_3c8._16_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_3c8 + 0x18),
                   (VkDescriptorPool)local_3c8._16_8_);
      }
      if (local_418.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_410,local_418);
      }
      return pTVar19;
    }
  } while( true );
}

Assistant:

tcu::TestStatus ImageSampleComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}